

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O2

uint Validator::constraintS5(Solution *solution)

{
  uint uVar1;
  bool bVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar3;
  Scenario *this;
  Nurse *this_00;
  string *psVar4;
  _Base_ptr p_Var5;
  uint uVar6;
  string local_90;
  Contract local_70;
  
  pmVar3 = Solution::getNurses_abi_cxx11_(solution);
  uVar6 = 0;
  for (p_Var5 = (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    this = Scenario::getInstance();
    this_00 = NurseSolution::getNurse(*(NurseSolution **)(p_Var5 + 2));
    psVar4 = Nurse::getContract_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)&local_90,(string *)psVar4);
    Scenario::getContract(&local_70,this,&local_90);
    bVar2 = Contract::getCompleteWeekends(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    uVar1 = uVar6;
    if (bVar2) {
      bVar2 = nurseWorkingHalfWeekEnd(*(NurseSolution **)(p_Var5 + 2));
      uVar1 = uVar6 + 0x1e;
      if (!bVar2) {
        uVar1 = uVar6;
      }
    }
    uVar6 = uVar1;
  }
  return uVar6;
}

Assistant:

unsigned int Validator::constraintS5(const Solution &solution) {

    unsigned int sum = 0;

    for(auto const &nurse : solution.getNurses())
        if(Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getCompleteWeekends())
            {
                if(nurseWorkingHalfWeekEnd(nurse.second))
                    sum += 30;
            }
    return sum;
}